

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

void __thiscall inja::ParserStatic::ParserStatic(ParserStatic *this)

{
  _Rb_tree_header *p_Var1;
  FunctionData *pFVar2;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  
  p_Var1 = &(this->functions).m_map._M_t._M_impl.super__Rb_tree_header;
  (this->functions).m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->functions).m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->functions).m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->functions).m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->functions).m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name.size_ = 7;
  name.data_ = "default";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name,2);
  pFVar2->op = Default;
  name_00.size_ = 0xb;
  name_00.data_ = "divisibleBy";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_00,2);
  pFVar2->op = DivisibleBy;
  name_01.size_ = 4;
  name_01.data_ = "even";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_01,1);
  pFVar2->op = Even;
  name_02.size_ = 5;
  name_02.data_ = "first";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_02,1);
  pFVar2->op = First;
  name_03.size_ = 5;
  name_03.data_ = "float";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_03,1);
  pFVar2->op = Float;
  name_04.size_ = 3;
  name_04.data_ = "int";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_04,1);
  pFVar2->op = Int;
  name_05.size_ = 4;
  name_05.data_ = "last";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_05,1);
  pFVar2->op = Last;
  name_06.size_ = 6;
  name_06.data_ = "length";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_06,1);
  pFVar2->op = Length;
  name_07.size_ = 5;
  name_07.data_ = "lower";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_07,1);
  pFVar2->op = Lower;
  name_08.size_ = 3;
  name_08.data_ = "max";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_08,1);
  pFVar2->op = Max;
  name_09.size_ = 3;
  name_09.data_ = "min";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_09,1);
  pFVar2->op = Min;
  name_10.size_ = 3;
  name_10.data_ = "odd";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_10,1);
  pFVar2->op = Odd;
  name_11.size_ = 5;
  name_11.data_ = "range";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_11,1);
  pFVar2->op = Range;
  name_12.size_ = 5;
  name_12.data_ = "round";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_12,2);
  pFVar2->op = Round;
  name_13.size_ = 4;
  name_13.data_ = "sort";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_13,1);
  pFVar2->op = Sort;
  name_14.size_ = 5;
  name_14.data_ = "upper";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_14,1);
  pFVar2->op = Upper;
  name_15.size_ = 6;
  name_15.data_ = "exists";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_15,1);
  pFVar2->op = Exists;
  name_16.size_ = 8;
  name_16.data_ = "existsIn";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_16,2);
  pFVar2->op = ExistsInObject;
  name_17.size_ = 9;
  name_17.data_ = "isBoolean";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_17,1);
  pFVar2->op = IsBoolean;
  name_18.size_ = 8;
  name_18.data_ = "isNumber";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_18,1);
  pFVar2->op = IsNumber;
  name_19.size_ = 9;
  name_19.data_ = "isInteger";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_19,1);
  pFVar2->op = IsInteger;
  name_20.size_ = 7;
  name_20.data_ = "isFloat";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_20,1);
  pFVar2->op = IsFloat;
  name_21.size_ = 8;
  name_21.data_ = "isObject";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_21,1);
  pFVar2->op = IsObject;
  name_22.size_ = 7;
  name_22.data_ = "isArray";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_22,1);
  pFVar2->op = IsArray;
  name_23.size_ = 8;
  name_23.data_ = "isString";
  pFVar2 = FunctionStorage::get_or_new(&this->functions,name_23,1);
  pFVar2->op = IsString;
  return;
}

Assistant:

ParserStatic() {
		functions.add_builtin("default", 2, Bytecode::Op::Default);
		functions.add_builtin("divisibleBy", 2, Bytecode::Op::DivisibleBy);
		functions.add_builtin("even", 1, Bytecode::Op::Even);
		functions.add_builtin("first", 1, Bytecode::Op::First);
		functions.add_builtin("float", 1, Bytecode::Op::Float);
		functions.add_builtin("int", 1, Bytecode::Op::Int);
		functions.add_builtin("last", 1, Bytecode::Op::Last);
		functions.add_builtin("length", 1, Bytecode::Op::Length);
		functions.add_builtin("lower", 1, Bytecode::Op::Lower);
		functions.add_builtin("max", 1, Bytecode::Op::Max);
		functions.add_builtin("min", 1, Bytecode::Op::Min);
		functions.add_builtin("odd", 1, Bytecode::Op::Odd);
		functions.add_builtin("range", 1, Bytecode::Op::Range);
		functions.add_builtin("round", 2, Bytecode::Op::Round);
		functions.add_builtin("sort", 1, Bytecode::Op::Sort);
		functions.add_builtin("upper", 1, Bytecode::Op::Upper);
		functions.add_builtin("exists", 1, Bytecode::Op::Exists);
		functions.add_builtin("existsIn", 2, Bytecode::Op::ExistsInObject);
		functions.add_builtin("isBoolean", 1, Bytecode::Op::IsBoolean);
		functions.add_builtin("isNumber", 1, Bytecode::Op::IsNumber);
		functions.add_builtin("isInteger", 1, Bytecode::Op::IsInteger);
		functions.add_builtin("isFloat", 1, Bytecode::Op::IsFloat);
		functions.add_builtin("isObject", 1, Bytecode::Op::IsObject);
		functions.add_builtin("isArray", 1, Bytecode::Op::IsArray);
		functions.add_builtin("isString", 1, Bytecode::Op::IsString);
	}